

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# durand_kerner_method.cc
# Opt level: O1

bool __thiscall
sptk::DurandKernerMethod::Run
          (DurandKernerMethod *this,vector<double,_std::allocator<double>_> *coefficients,
          vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *roots,
          bool *is_converged)

{
  double *pdVar1;
  double *pdVar2;
  pointer pdVar3;
  pointer pdVar4;
  double dVar5;
  double dVar6;
  undefined1 auVar7 [16];
  bool bVar8;
  uint uVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  size_type __new_size;
  pointer pcVar13;
  complex<double> *__z;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  double dVar18;
  double dVar19;
  double local_b8;
  double dStack_b0;
  double local_98;
  double dStack_90;
  ulong local_80;
  pointer local_78;
  double *local_70;
  undefined8 local_68;
  undefined8 uStack_60;
  double local_58;
  double dStack_50;
  complex<double> local_48;
  
  if (this->is_valid_ != true) {
    return false;
  }
  bVar8 = false;
  if (((is_converged != (bool *)0x0) &&
      (bVar8 = false,
      roots != (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)0x0)) &&
     (__new_size = (size_type)this->num_order_, bVar8 = false,
     (long)(coefficients->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish -
     (long)(coefficients->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start >> 3 == __new_size)) {
    if ((long)(roots->
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>).
              _M_impl.super__Vector_impl_data._M_finish -
        (long)(roots->
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>).
              _M_impl.super__Vector_impl_data._M_start >> 4 != __new_size) {
      std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::resize
                (roots,__new_size);
    }
    pdVar2 = (coefficients->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pcVar13 = (roots->
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>).
              _M_impl.super__Vector_impl_data._M_start;
    *is_converged = false;
    uVar10 = (ulong)(uint)this->num_order_;
    dVar19 = 0.0;
    if (1 < this->num_order_) {
      lVar11 = 1;
      dVar18 = 0.0;
      do {
        pdVar1 = pdVar2 + lVar11;
        lVar11 = lVar11 + 1;
        dVar5 = pow(ABS(*pdVar1),1.0 / (double)(int)lVar11);
        dVar19 = dVar5 + dVar5;
        if (dVar5 + dVar5 <= dVar18) {
          dVar19 = dVar18;
        }
        uVar10 = (ulong)this->num_order_;
        dVar18 = dVar19;
      } while (lVar11 < (long)uVar10);
    }
    if (0 < (int)uVar10) {
      dVar18 = -*pdVar2 / (double)(int)uVar10;
      pdVar3 = (this->cosine_table_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar4 = (this->sine_table_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar11 = 0;
      do {
        *(double *)(pcVar13->_M_value + lVar11 * 2) =
             *(double *)((long)pdVar3 + lVar11) * dVar19 + dVar18;
        *(double *)(pcVar13->_M_value + lVar11 * 2 + 8) =
             *(double *)((long)pdVar4 + lVar11) * dVar19 + dVar18;
        lVar11 = lVar11 + 8;
      } while ((uVar10 & 0xffffffff) << 3 != lVar11);
    }
    if (0 < this->num_iteration_) {
      local_80 = 0;
      local_78 = pcVar13;
      local_70 = pdVar2;
      do {
        if (this->num_order_ < 1) {
LAB_0010651e:
          *is_converged = true;
          break;
        }
        bVar8 = true;
        lVar11 = 0;
        do {
          if (this->num_order_ < 1) {
            dStack_b0 = 0.0;
            dVar18 = 0.0;
            uVar14 = 0;
            uVar15 = 0x3ff00000;
            dVar19 = 0.0;
          }
          else {
            __z = pcVar13 + lVar11;
            lVar12 = 0;
            dVar18 = 1.0;
            dVar19 = 0.0;
            local_b8 = 1.0;
            dStack_b0 = 0.0;
            do {
              local_98 = dVar18;
              dStack_90 = dVar19;
              std::complex<double>::operator*=((complex<double> *)&local_98,__z);
              dVar19 = dStack_90;
              dVar18 = local_98;
              dVar5 = local_70[lVar12];
              uVar14 = SUB84(dVar5,0);
              uVar15 = (int)((ulong)dVar5 >> 0x20);
              uVar16 = 0;
              uVar17 = 0;
              if (lVar11 != lVar12) {
                uStack_60 = 0;
                dVar6 = *(double *)(__z->_M_value + 8) - *(double *)(pcVar13->_M_value + 8);
                local_48._M_value._8_4_ = SUB84(dVar6,0);
                local_48._M_value._0_8_ = *(double *)__z->_M_value - *(double *)pcVar13->_M_value;
                local_48._M_value._12_4_ = (int)((ulong)dVar6 >> 0x20);
                local_98 = local_b8;
                dStack_90 = dStack_b0;
                local_58 = dVar18;
                dStack_50 = dVar19;
                local_68 = dVar5;
                std::complex<double>::operator*=((complex<double> *)&local_98,&local_48);
                local_b8 = local_98;
                dStack_b0 = dStack_90;
                uVar14 = (undefined4)local_68;
                uVar15 = local_68._4_4_;
                uVar16 = (undefined4)uStack_60;
                uVar17 = uStack_60._4_4_;
                dVar18 = local_58;
                dVar19 = dStack_50;
              }
              dVar18 = dVar18 + (double)CONCAT44(uVar15,uVar14);
              dVar19 = dVar19 + (double)CONCAT44(uVar17,uVar16);
              lVar12 = lVar12 + 1;
              pcVar13 = pcVar13 + 1;
            } while (lVar12 < this->num_order_);
            uVar14 = SUB84(local_b8,0);
            uVar15 = (undefined4)((ulong)local_b8 >> 0x20);
            pcVar13 = local_78;
          }
          if ((((double)CONCAT44(uVar15,uVar14) != 0.0) || (NAN((double)CONCAT44(uVar15,uVar14))))
             || ((dStack_b0 != 0.0 || (NAN(dStack_b0))))) {
            dVar18 = (double)__divdc3(SUB84(dVar18,0),dVar19,uVar14);
            dVar19 = *(double *)(pcVar13[lVar11]._M_value + 8) - dVar19;
            auVar7._8_4_ = SUB84(dVar19,0);
            auVar7._0_8_ = *(double *)pcVar13[lVar11]._M_value - dVar18;
            auVar7._12_4_ = (int)((ulong)dVar19 >> 0x20);
            *(undefined1 (*) [16])pcVar13[lVar11]._M_value = auVar7;
            if ((bVar8) &&
               (dVar19 = this->convergence_threshold_, dVar18 = cabs(dVar18), dVar19 < dVar18)) {
              bVar8 = false;
            }
          }
          else {
            *(undefined8 *)pcVar13[lVar11]._M_value = 0;
            *(undefined8 *)(pcVar13[lVar11]._M_value + 8) = 0;
          }
          lVar11 = lVar11 + 1;
        } while (lVar11 < this->num_order_);
        if (bVar8) goto LAB_0010651e;
        uVar9 = (int)local_80 + 1;
        local_80 = (ulong)uVar9;
      } while ((int)uVar9 < this->num_iteration_);
    }
    bVar8 = true;
  }
  return bVar8;
}

Assistant:

bool DurandKernerMethod::Run(const std::vector<double>& coefficients,
                             std::vector<std::complex<double> >* roots,
                             bool* is_converged) const {
  // Check inputs.
  if (!is_valid_ ||
      coefficients.size() != static_cast<std::size_t>(num_order_) ||
      NULL == roots || NULL == is_converged) {
    return false;
  }

  // Prepare memories.
  if (roots->size() != static_cast<std::size_t>(num_order_)) {
    roots->resize(num_order_);
  }

  const double* a(&(coefficients[0]));
  std::complex<double>* x(&((*roots)[0]));

  *is_converged = false;

  // Set initial roots using the Aberth's approach.
  {
    double radius(0.0);
    for (int m(1); m < num_order_; ++m) {
      const double r(2.0 * std::pow(std::fabs(a[m]), 1.0 / (m + 1)));
      if (radius < r) {
        radius = r;
      }
    }

    const double center(-a[0] / num_order_);
    for (int m(0); m < num_order_; ++m) {
      x[m].real(center + radius * cosine_table_[m]);
      x[m].imag(center + radius * sine_table_[m]);
    }
  }

  // Find roots using the Durand-Kerner method.
  for (int n(0); n < num_iteration_; ++n) {
    bool halt(true);

    for (int m(0); m < num_order_; ++m) {
      std::complex<double> numerator(1.0);
      std::complex<double> denominator(1.0);
      for (int l(0); l < num_order_; ++l) {
        numerator = numerator * x[m] + std::complex<double>(a[l]);
        if (m != l) denominator = denominator * (x[m] - x[l]);
      }
      if (0.0 == denominator.real() && 0.0 == denominator.imag()) {
        x[m] = 0.0;
      } else {
        const std::complex<double> delta(numerator / denominator);
        x[m] -= delta;
        if (halt && convergence_threshold_ < std::abs(delta)) {
          halt = false;
        }
      }
    }

    if (halt) {
      *is_converged = true;
      break;
    }
  }

  return true;
}